

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O1

void __thiscall OpenMD::MAW::calcForce(MAW *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  char cVar3;
  pointer piVar4;
  uint i_5;
  RotMat3x3d *pRVar5;
  undefined8 *puVar6;
  uint i;
  long lVar7;
  double *pdVar8;
  uint i_1;
  RotMat3x3d *pRVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  long lVar15;
  byte bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  Vector<double,_3U> result;
  Vector3d dVangdu;
  Vector3d flab;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_15;
  Vector<double,_3U> result_12;
  RotMat3x3d Atrans;
  Vector<double,_3U> result_9;
  undefined8 local_228;
  undefined8 uStack_220;
  double local_218 [8];
  double local_1d8 [4];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168 [4];
  double local_148;
  undefined8 uStack_140;
  double local_138 [4];
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  double local_d8;
  double local_d0;
  double local_c8 [4];
  undefined8 local_a8 [10];
  double local_58 [4];
  double local_38 [4];
  
  bVar16 = 0;
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar4 = (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = *(long *)&(this->MixingMap).
                     super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[piVar4[idat->atid1]].
                     super__Vector_base<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>
                     ._M_impl.super__Vector_impl_data;
  lVar15 = (long)piVar4[idat->atid2] * 0x30;
  local_198 = *(double *)(lVar10 + lVar15);
  dVar21 = *(double *)(lVar10 + 8 + lVar15);
  dVar26 = *(double *)(lVar10 + 0x10 + lVar15);
  local_1d8[3] = *(double *)(lVar10 + 0x20 + lVar15);
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[8] = 0;
  local_148 = *(double *)(lVar10 + 0x18 + lVar15);
  uStack_140 = 0;
  if (*(char *)(lVar10 + 0x29 + lVar15) == '\x01') {
    pRVar5 = &idat->A1;
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[0] = 0.0;
    lVar7 = 0;
    pRVar9 = pRVar5;
    do {
      dVar19 = (double)(&local_228)[lVar7];
      lVar11 = 0;
      do {
        dVar19 = dVar19 + (pRVar9->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar11] * (idat->d).super_Vector<double,_3U>.data_[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      (&local_228)[lVar7] = dVar19;
      lVar7 = lVar7 + 1;
      pRVar9 = (RotMat3x3d *)
               ((pRVar9->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar7 != 3);
    pdVar8 = (double *)&local_228;
    local_178 = local_228;
    uStack_170 = 0;
    local_188 = uStack_220;
    dStack_180 = local_218[0];
    local_218[4] = 0.0;
    local_218[5] = 0.0;
    local_218[2] = 0.0;
    local_218[3] = 0.0;
    local_218[0] = 0.0;
    local_218[1] = 0.0;
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[6] = 0.0;
    lVar7 = 0;
    do {
      lVar11 = 0;
      pdVar12 = pdVar8;
      do {
        *pdVar12 = (pRVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                   [lVar11];
        lVar11 = lVar11 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar11 != 3);
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + 1;
      pRVar5 = (RotMat3x3d *)
               ((pRVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      *(undefined8 *)((long)local_a8 + lVar7 + 0x10) = *(undefined8 *)((long)local_218 + lVar7);
      *(undefined8 *)((long)local_a8 + lVar7) = *(undefined8 *)((long)&local_228 + lVar7);
      *(undefined8 *)((long)local_a8 + lVar7 + 8) = *(undefined8 *)((long)&uStack_220 + lVar7);
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
  }
  else {
    pRVar5 = &idat->A2;
    pdVar8 = (double *)&local_228;
    pRVar9 = pRVar5;
    pdVar12 = pdVar8;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      *pdVar12 = (pRVar9->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                 [0];
      pRVar9 = (RotMat3x3d *)((long)pRVar9 + (ulong)bVar16 * -0x10 + 8);
      pdVar12 = pdVar12 + (ulong)bVar16 * -2 + 1;
    }
    lVar7 = 0;
    do {
      lVar11 = 0;
      do {
        pdVar8[lVar11] = -pdVar8[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar7 != 3);
    local_168[0] = 0.0;
    local_168[1] = 0.0;
    local_168[2] = 0.0;
    puVar6 = &local_228;
    lVar7 = 0;
    do {
      dVar19 = local_168[lVar7];
      lVar11 = 0;
      do {
        dVar19 = dVar19 + (double)puVar6[lVar11] * (idat->d).super_Vector<double,_3U>.data_[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      local_168[lVar7] = dVar19;
      lVar7 = lVar7 + 1;
      puVar6 = puVar6 + 3;
    } while (lVar7 != 3);
    local_178 = local_168[0];
    uStack_170 = 0;
    local_188 = local_168[1];
    dStack_180 = local_168[2];
    pdVar8 = (double *)&local_228;
    local_218[4] = 0.0;
    local_218[5] = 0.0;
    local_218[2] = 0.0;
    local_218[3] = 0.0;
    local_218[0] = 0.0;
    local_218[1] = 0.0;
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[6] = 0.0;
    lVar7 = 0;
    do {
      lVar11 = 0;
      pdVar12 = pdVar8;
      do {
        *pdVar12 = (pRVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                   [lVar11];
        lVar11 = lVar11 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar11 != 3);
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + 1;
      pRVar5 = (RotMat3x3d *)
               ((pRVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      *(undefined8 *)((long)local_a8 + lVar7 + 0x10) = *(undefined8 *)((long)local_218 + lVar7);
      *(undefined8 *)((long)local_a8 + lVar7) = *(undefined8 *)((long)&local_228 + lVar7);
      *(undefined8 *)((long)local_a8 + lVar7 + 8) = *(undefined8 *)((long)&uStack_220 + lVar7);
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
  }
  uStack_100 = 0;
  local_118 = -dVar26;
  uStack_110 = 0x8000000000000000;
  local_108 = dVar26;
  local_d0 = exp((idat->rij - dVar21) * local_118);
  uVar23 = SUB84(local_d0,0);
  uVar24 = (undefined4)((ulong)local_d0 >> 0x20);
  local_d8 = local_d0 * local_d0;
  dVar26 = local_d8 - (local_d0 + local_d0);
  if (idat->shiftedPot == false) {
    dVar19 = 0.0;
    uVar17 = 0;
    uVar18 = 0;
    dVar33 = local_198 + local_198;
    if (idat->shiftedForce != true) goto LAB_001d532e;
  }
  dVar21 = (idat->rcut - dVar21) * local_118;
  local_118 = local_198 + local_198;
  dVar19 = exp(dVar21);
  uVar17 = SUB84(dVar19,0);
  uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
  uVar23 = SUB84(local_d0,0);
  uVar24 = (undefined4)((ulong)local_d0 >> 0x20);
  dVar19 = dVar19 * dVar19;
  dVar33 = local_118;
LAB_001d532e:
  dVar33 = dVar33 * local_108;
  if (idat->shiftedPot == true) {
    dVar22 = local_198 *
             (dVar19 - ((double)CONCAT44(uVar18,uVar17) + (double)CONCAT44(uVar18,uVar17)));
    dVar21 = 0.0;
  }
  else {
    dVar21 = 0.0;
    dVar22 = 0.0;
    if (idat->shiftedForce == true) {
      dVar21 = ((double)CONCAT44(uVar18,uVar17) - dVar19) * dVar33;
      dVar22 = (idat->rij - idat->rcut) * dVar21 +
               local_198 *
               (dVar19 - ((double)CONCAT44(uVar18,uVar17) + (double)CONCAT44(uVar18,uVar17)));
    }
  }
  dVar22 = dVar26 * local_198 - dVar22;
  dVar26 = idat->rij;
  dVar19 = idat->r2;
  local_198 = dStack_180;
  dStack_190 = dStack_180;
  local_108 = local_1d8[3] * dStack_180;
  uStack_100 = 0;
  dVar25 = local_148 / -3.0 + 0.8 +
           local_108 / dVar26 + (local_148 * local_178 * local_178) / dVar19;
  dVar1 = idat->vdwMult;
  dVar20 = dVar22 * dVar1;
  dVar31 = dVar20 * dVar25;
  idat->vpair = idat->vpair + dVar31;
  dVar2 = idat->sw;
  dVar31 = dVar31 * dVar2;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar31;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar31 + (idat->selePot).data_[1];
  }
  dVar31 = dVar19 * dVar26;
  dVar32 = dVar19 * dVar19;
  lVar7 = 0;
  local_1d8[0] = local_178;
  local_1d8[1] = local_188;
  local_1d8[2] = dStack_180;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  do {
    local_138[lVar7] =
         local_1d8[lVar7] * (dVar33 * ((double)CONCAT44(uVar24,uVar23) - local_d8) - dVar21);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_228 = 0.0;
  uStack_220 = 0.0;
  local_218[0] = 0.0;
  lVar7 = 0;
  do {
    (&local_228)[lVar7] = local_138[lVar7] / dVar26;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_168[2] = local_218[0];
  local_168[0] = local_228;
  local_168[1] = uStack_220;
  dVar21 = local_148 * -2.0;
  dVar34 = local_178 * local_178 * dVar21;
  dVar33 = local_178 * local_148 * 2.0;
  local_148 = dVar19;
  uStack_140 = 0;
  auVar29._8_8_ = local_178 * dVar34;
  auVar29._0_8_ = dVar33;
  auVar30._8_8_ = dVar32;
  auVar30._0_8_ = dVar19;
  auVar30 = divpd(auVar29,auVar30);
  auVar27._0_8_ = dStack_180 * local_1d8[3] * local_178;
  auVar27._8_8_ = local_188 * local_108;
  auVar28._8_8_ = dVar31;
  auVar28._0_8_ = dVar31;
  auVar28 = divpd(auVar27,auVar28);
  local_138[0] = (auVar30._8_8_ + auVar30._0_8_) - auVar28._0_8_;
  local_138[1] = (local_188 * dVar34) / dVar32 - auVar28._8_8_;
  local_138[2] = (local_1d8[3] / dVar26 + (dVar34 * dStack_180) / dVar32) -
                 (dStack_180 * dStack_180 * local_1d8[3]) / dVar31;
  local_228 = 0.0;
  uStack_220 = 0.0;
  local_218[0] = 0.0;
  lVar7 = 0;
  do {
    (&local_228)[lVar7] = local_168[lVar7] * dVar25;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  local_1d8[2] = 0.0;
  lVar7 = 0;
  do {
    local_1d8[lVar7] = local_138[lVar7] * dVar22;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  lVar7 = 0;
  do {
    local_38[lVar7] = (double)(&local_228)[lVar7] + local_1d8[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_1d8[0] = (local_1d8[3] * local_188) / dVar26;
  local_1d8[1] = (dVar33 * dStack_180) / dVar19 - (local_1d8[3] * local_178) / dVar26;
  local_1d8[2] = (local_178 * dVar21 * local_188) / dVar19;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a8 = 0.0;
  lVar7 = 0;
  do {
    (&local_1b8)[lVar7] = local_1d8[lVar7] * dVar20;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_228 = 0.0;
  uStack_220 = 0.0;
  local_218[0] = 0.0;
  lVar7 = 0;
  do {
    (&local_228)[lVar7] = (double)(&local_1b8)[lVar7] * dVar2;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_58[2] = local_218[0];
  local_58[0] = local_228;
  local_58[1] = uStack_220;
  cVar3 = *(char *)(lVar10 + lVar15 + 0x29);
  if (cVar3 == '\x01') {
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[0] = 0.0;
    puVar6 = local_a8;
    lVar10 = 0;
    do {
      dVar21 = (double)(&local_228)[lVar10];
      lVar15 = 0;
      do {
        dVar21 = dVar21 + (double)puVar6[lVar15] * local_58[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      (&local_228)[lVar10] = dVar21;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 3;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      (idat->t1).super_Vector<double,_3U>.data_[lVar10] =
           (double)(&local_228)[lVar10] + (idat->t1).super_Vector<double,_3U>.data_[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
  }
  else {
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[0] = 0.0;
    puVar6 = local_a8;
    lVar10 = 0;
    do {
      dVar21 = (double)(&local_228)[lVar10];
      lVar15 = 0;
      do {
        dVar21 = dVar21 + (double)puVar6[lVar15] * local_58[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      (&local_228)[lVar10] = dVar21;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 3;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      (idat->t2).super_Vector<double,_3U>.data_[lVar10] =
           (double)(&local_228)[lVar10] + (idat->t2).super_Vector<double,_3U>.data_[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
  }
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  lVar10 = 0;
  do {
    local_c8[lVar10] = local_38[lVar10] * dVar1 * dVar2;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a8 = 0.0;
  if (cVar3 == '\0') {
    puVar6 = &local_228;
    puVar13 = local_a8;
    puVar14 = puVar6;
    for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar14 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
      puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
    }
    lVar10 = 0;
    do {
      lVar15 = 0;
      do {
        puVar6[lVar15] = puVar6[lVar15] ^ 0x8000000000000000;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 3;
    } while (lVar10 != 3);
    local_f8 = 0;
    uStack_f0 = 0;
    local_e8 = 0;
    puVar6 = &local_228;
    lVar10 = 0;
    do {
      dVar21 = (double)(&local_f8)[lVar10];
      lVar15 = 0;
      do {
        dVar21 = dVar21 + (double)puVar6[lVar15] * local_c8[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      (&local_f8)[lVar10] = dVar21;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 3;
    } while (lVar10 != 3);
    local_1a8 = (double)local_e8;
    local_228._0_4_ = (undefined4)local_f8;
    local_228._4_4_ = local_f8._4_4_;
    uStack_220._0_4_ = (undefined4)uStack_f0;
    uStack_220._4_4_ = uStack_f0._4_4_;
  }
  else {
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[0] = 0.0;
    puVar6 = local_a8;
    lVar10 = 0;
    do {
      dVar21 = (double)(&local_228)[lVar10];
      lVar15 = 0;
      do {
        dVar21 = dVar21 + (double)puVar6[lVar15] * local_c8[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      (&local_228)[lVar10] = dVar21;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 3;
    } while (lVar10 != 3);
    local_1a8 = local_218[0];
  }
  local_1b8 = CONCAT44(local_228._4_4_,(undefined4)local_228);
  uStack_1b0 = CONCAT44(uStack_220._4_4_,(undefined4)uStack_220);
  lVar10 = 0;
  do {
    (idat->f1).super_Vector<double,_3U>.data_[lVar10] =
         (double)(&local_1b8)[lVar10] + (idat->f1).super_Vector<double,_3U>.data_[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  return;
}

Assistant:

void MAW::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    MAWInteractionData& mixer =
        MixingMap[MAWtids[idat.atid1]][MAWtids[idat.atid2]];

    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    RealType D_e  = mixer.De;
    RealType R_e  = mixer.Re;
    RealType beta = mixer.beta;
    RealType ca1  = mixer.ca1;
    RealType cb1  = mixer.cb1;

    Vector3d r;
    RotMat3x3d Atrans;
    if (mixer.j_is_Metal) {
      // rotate the inter-particle separation into the two different
      // body-fixed coordinate systems:
      r      = idat.A1 * idat.d;
      Atrans = idat.A1.transpose();
    } else {
      // negative sign because this is the vector from j to i:
      r      = -idat.A2 * idat.d;
      Atrans = idat.A2.transpose();
    }

    // V(r) = D_e exp(-a(r-re)(exp(-a(r-re))-2)

    RealType expt    = -beta * (idat.rij - R_e);
    RealType expfnc  = exp(expt);
    RealType expfnc2 = expfnc * expfnc;

    RealType exptC    = 0.0;
    RealType expfncC  = 0.0;
    RealType expfnc2C = 0.0;

    myPot   = D_e * (expfnc2 - 2.0 * expfnc);
    myDeriv = 2.0 * D_e * beta * (expfnc - expfnc2);

    if (idat.shiftedPot || idat.shiftedForce) {
      exptC    = -beta * (idat.rcut - R_e);
      expfncC  = exp(exptC);
      expfnc2C = expfncC * expfncC;
    }

    if (idat.shiftedPot) {
      myPotC   = D_e * (expfnc2C - 2.0 * expfncC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      myPotC   = D_e * (expfnc2C - 2.0 * expfncC);
      myDerivC = 2.0 * D_e * beta * (expfncC - expfnc2C);
      myPotC += myDerivC * (idat.rij - idat.rcut);
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType x  = r.x();
    RealType y  = r.y();
    RealType z  = r.z();
    RealType x2 = x * x;
    RealType z2 = z * z;

    RealType r3 = idat.r2 * idat.rij;
    RealType r4 = idat.r2 * idat.r2;

    // angular modulation of morse part of potential to approximate
    // the squares of the two HOMO lone pair orbitals in water:
    //********************** old form*************************
    // s = 1 / (4 pi)
    // ta1 = (s - pz)^2 = (1 - sqrt(3)*cos(theta))^2 / (4 pi)
    // b1 = px^2 = 3 * (sin(theta)*cos(phi))^2 / (4 pi)
    //********************** old form*************************
    // we'll leave out the 4 pi for now

    // new functional form just using the p orbitals.
    // Vmorse(r)*[a*p_x + b p_z + (1-a-b)]
    // which is
    // Vmorse(r)*[a sin^2(theta) cos^2(phi) + b cos(theta) + (1-a-b)]
    // Vmorse(r)*[a*x2/r2 + b*z/r + (1-a-b)]

    RealType Vmorse = (myPot - myPotC);
    RealType Vang = ca1 * x2 / idat.r2 + cb1 * z / idat.rij + (0.8 - ca1 / 3.0);

    RealType pot_temp = idat.vdwMult * Vmorse * Vang;
    idat.vpair += pot_temp;
    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    Vector3d dVmorsedr = (myDeriv - myDerivC) * Vector3d(x, y, z) / idat.rij;

    Vector3d dVangdr = Vector3d(
        -2.0 * ca1 * x2 * x / r4 + 2.0 * ca1 * x / idat.r2 - cb1 * x * z / r3,
        -2.0 * ca1 * x2 * y / r4 - cb1 * z * y / r3,
        -2.0 * ca1 * x2 * z / r4 + cb1 / idat.rij - cb1 * z2 / r3);

    // chain rule to put these back on x, y, z

    Vector3d dvdr = Vang * dVmorsedr + Vmorse * dVangdr;

    // Torques for Vang using method of Price:
    // S. L. Price, A. J. Stone, and M. Alderton, Mol. Phys. 52, 987 (1984).

    Vector3d dVangdu = Vector3d(
        cb1 * y / idat.rij, 2.0 * ca1 * x * z / idat.r2 - cb1 * x / idat.rij,
        -2.0 * ca1 * y * x / idat.r2);

    // do the torques first since they are easy:
    // remember that these are still in the body fixed axes

    Vector3d trq = idat.vdwMult * Vmorse * dVangdu * idat.sw;

    // go back to lab frame using transpose of rotation matrix:

    if (mixer.j_is_Metal) {
      idat.t1 += Atrans * trq;
    } else {
      idat.t2 += Atrans * trq;
    }

    // Now, on to the forces (still in body frame of water)

    Vector3d ftmp = idat.vdwMult * idat.sw * dvdr;

    // rotate the terms back into the lab frame:
    Vector3d flab;
    if (mixer.j_is_Metal) {
      flab = Atrans * ftmp;
    } else {
      flab = -Atrans * ftmp;
    }

    idat.f1 += flab;

    return;
  }